

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
* __thiscall
pstore::json::details::
token_matcher<callbacks_proxy<mock_json_callbacks>,_pstore::json::details::false_complete>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
           *__return_storage_ptr__,
          token_matcher<callbacks_proxy<mock_json_callbacks>,_pstore::json::details::false_complete>
          *this,parser<callbacks_proxy<mock_json_callbacks>_> *parser,maybe<char,_void> *ch)

{
  mock_json_callbacks *pmVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  error_category *peVar8;
  error_category *extraout_RDX;
  bool bVar9;
  error_code err;
  error_code err_00;
  
  iVar4 = (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_;
  if (iVar4 == 2) {
    if (ch->valid_ == true) {
      pcVar7 = maybe<char,_void>::operator->(ch);
      pcVar6 = this->text_;
      if (*pcVar7 == *pcVar6) {
        this->text_ = pcVar6 + 1;
        bVar2 = true;
        if (pcVar6[1] != '\0') goto LAB_00134029;
        iVar4 = 3;
        bVar9 = true;
        goto LAB_00134025;
      }
    }
LAB_00134004:
    peVar8 = get_error_category();
    err_00._M_cat = peVar8;
    err_00._0_8_ = 0xb;
    bVar3 = parser<callbacks_proxy<mock_json_callbacks>_>::set_error(parser,err_00);
    bVar2 = true;
    iVar4 = 1;
    bVar9 = true;
    if (!bVar3) goto LAB_00134029;
  }
  else {
    bVar9 = true;
    bVar2 = true;
    if (iVar4 != 3) {
      if (iVar4 == 1) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x1ad);
      }
      goto LAB_00134029;
    }
    if (ch->valid_ == true) {
      pcVar6 = maybe<char,_void>::operator->(ch);
      iVar4 = isalnum((int)*pcVar6);
      if (iVar4 != 0) goto LAB_00134004;
      bVar9 = false;
    }
    pmVar1 = (parser->callbacks_).original_;
    uVar5 = (*(pmVar1->super_json_callbacks_base)._vptr_json_callbacks_base[6])(pmVar1,0);
    err._4_4_ = 0;
    err._M_value = uVar5;
    err._M_cat = extraout_RDX;
    bVar2 = parser<callbacks_proxy<mock_json_callbacks>_>::set_error(parser,err);
    iVar4 = 1;
    if (bVar2) {
      (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 1;
    }
  }
LAB_00134025:
  bVar2 = bVar9;
  (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = iVar4;
LAB_00134029:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
       = 0;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl = (matcher<callbacks_proxy<mock_json_callbacks>_> *)0x0;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
       = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
          )0x1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl = (matcher<callbacks_proxy<mock_json_callbacks>_> *)0x0;
  __return_storage_ptr__->second = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            token_matcher<Callbacks, DoneFunction>::consume (parser<Callbacks> & parser,
                                                             maybe<char> ch) {
                bool match = true;
                switch (this->get_state ()) {
                case start_state:
                    if (!ch || *ch != *text_) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        ++text_;
                        if (*text_ == '\0') {
                            // We've run out of input text, so ensure that the next character isn't
                            // alpha-numeric.
                            this->set_state (last_state);
                        }
                    }
                    break;
                case last_state:
                    if (ch) {
                        if (std::isalnum (*ch) != 0) {
                            this->set_error (parser, error_code::unrecognized_token);
                            return {nullptr, true};
                        }
                        match = false;
                    }
                    this->set_error (parser, done_ (parser));
                    this->set_state (done_state);
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, match};
            }